

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

BlendFunc StringToBlendFunc(string *m)

{
  bool bVar1;
  Logger *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *m_local;
  
  local_18 = m;
  bVar1 = std::operator==(m,"GL_ONE");
  if (bVar1) {
    m_local._4_4_ = BLEND_GL_ONE;
  }
  else {
    bVar1 = std::operator==(local_18,"GL_ZERO");
    if (bVar1) {
      m_local._4_4_ = BLEND_GL_ZERO;
    }
    else {
      bVar1 = std::operator==(local_18,"GL_SRC_ALPHA");
      if (bVar1) {
        m_local._4_4_ = BLEND_GL_SRC_ALPHA;
      }
      else {
        bVar1 = std::operator==(local_18,"GL_ONE_MINUS_SRC_ALPHA");
        if (bVar1) {
          m_local._4_4_ = BLEND_GL_ONE_MINUS_SRC_ALPHA;
        }
        else {
          bVar1 = std::operator==(local_18,"GL_ONE_MINUS_DST_COLOR");
          if (bVar1) {
            m_local._4_4_ = BLEND_GL_ONE_MINUS_DST_COLOR;
          }
          else {
            this = Assimp::DefaultLogger::get();
            std::operator+(&local_38,"Q3Shader: Unknown blend function: ",local_18);
            Assimp::Logger::error(this,&local_38);
            std::__cxx11::string::~string((string *)&local_38);
            m_local._4_4_ = BLEND_NONE;
          }
        }
      }
    }
  }
  return m_local._4_4_;
}

Assistant:

Q3Shader::BlendFunc StringToBlendFunc(const std::string& m)
{
    if (m == "GL_ONE") {
        return Q3Shader::BLEND_GL_ONE;
    }
    if (m == "GL_ZERO") {
        return Q3Shader::BLEND_GL_ZERO;
    }
    if (m == "GL_SRC_ALPHA") {
        return Q3Shader::BLEND_GL_SRC_ALPHA;
    }
    if (m == "GL_ONE_MINUS_SRC_ALPHA") {
        return Q3Shader::BLEND_GL_ONE_MINUS_SRC_ALPHA;
    }
    if (m == "GL_ONE_MINUS_DST_COLOR") {
        return Q3Shader::BLEND_GL_ONE_MINUS_DST_COLOR;
    }
    ASSIMP_LOG_ERROR("Q3Shader: Unknown blend function: " + m);
    return Q3Shader::BLEND_NONE;
}